

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall antlr::Parser::traceOut(Parser *this,char *rname)

{
  ostream *poVar1;
  int i;
  int iVar2;
  char *pcVar3;
  TokenRefCount<antlr::Token> local_50;
  char *local_48 [4];
  
  for (iVar2 = 0; iVar2 < this->traceDepth; iVar2 = iVar2 + 1) {
    std::operator<<((ostream *)&std::cout," ");
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"< ");
  poVar1 = std::operator<<(poVar1,rname);
  poVar1 = std::operator<<(poVar1,"; LA(1)==");
  (*this->_vptr_Parser[3])(&local_50,this,1);
  (*(local_50.ref)->ptr->_vptr_Token[4])(local_48);
  poVar1 = std::operator<<(poVar1,local_48[0]);
  pcVar3 = "";
  if (0 < ((this->inputState).ref)->ptr->guessing) {
    pcVar3 = " [guessing]";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_48);
  TokenRefCount<antlr::Token>::~TokenRefCount(&local_50);
  this->traceDepth = this->traceDepth + -1;
  return;
}

Assistant:

void Parser::traceOut(const char* rname)
{
	for( int i = 0; i < traceDepth; i++ )
		ANTLR_USE_NAMESPACE(std)cout << " ";

	ANTLR_USE_NAMESPACE(std)cout << "< " << rname
		<< "; LA(1)==" << LT(1)->getText().c_str()
		<<	((inputState->guessing>0)?" [guessing]":"")
		<< ANTLR_USE_NAMESPACE(std)endl;

	traceDepth--;
}